

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O1

Fl_Boxtype fl_define_FL_GTK_UP_BOX(void)

{
  fl_internal_boxtype(_FL_GTK_UP_BOX,gtk_up_box);
  fl_internal_boxtype(_FL_GTK_DOWN_BOX,gtk_down_box);
  fl_internal_boxtype(_FL_GTK_UP_FRAME,gtk_up_frame);
  fl_internal_boxtype(_FL_GTK_DOWN_FRAME,gtk_down_frame);
  fl_internal_boxtype(_FL_GTK_THIN_UP_BOX,gtk_thin_up_box);
  fl_internal_boxtype(_FL_GTK_THIN_DOWN_BOX,gtk_thin_down_box);
  fl_internal_boxtype(_FL_GTK_THIN_UP_FRAME,gtk_thin_up_frame);
  fl_internal_boxtype(_FL_GTK_THIN_DOWN_FRAME,gtk_thin_down_frame);
  fl_internal_boxtype(_FL_GTK_ROUND_UP_BOX,gtk_round_up_box);
  fl_internal_boxtype(_FL_GTK_ROUND_DOWN_BOX,gtk_round_down_box);
  return _FL_GTK_UP_BOX;
}

Assistant:

Fl_Boxtype fl_define_FL_GTK_UP_BOX() {
  fl_internal_boxtype(_FL_GTK_UP_BOX, gtk_up_box);
  fl_internal_boxtype(_FL_GTK_DOWN_BOX, gtk_down_box);
  fl_internal_boxtype(_FL_GTK_UP_FRAME, gtk_up_frame);
  fl_internal_boxtype(_FL_GTK_DOWN_FRAME, gtk_down_frame);
  fl_internal_boxtype(_FL_GTK_THIN_UP_BOX, gtk_thin_up_box);
  fl_internal_boxtype(_FL_GTK_THIN_DOWN_BOX, gtk_thin_down_box);
  fl_internal_boxtype(_FL_GTK_THIN_UP_FRAME, gtk_thin_up_frame);
  fl_internal_boxtype(_FL_GTK_THIN_DOWN_FRAME, gtk_thin_down_frame);
  fl_internal_boxtype(_FL_GTK_ROUND_UP_BOX, gtk_round_up_box);
  fl_internal_boxtype(_FL_GTK_ROUND_DOWN_BOX, gtk_round_down_box);

  return _FL_GTK_UP_BOX;
}